

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::unary<double,_tcu::Vector<unsigned_int,_2>_>::call
          (unary<double,_tcu::Vector<unsigned_int,_2>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  functionPointer p_function;
  Vector<unsigned_int,_2> arg;
  double result;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  unary<double,_tcu::Vector<unsigned_int,_2>_> *this_local;
  
  tcu::Vector<unsigned_int,_2>::Vector((Vector<unsigned_int,_2> *)&p_function);
  unpack<tcu::Vector<unsigned_int,_2>_>::get(argument_src,(Vector<unsigned_int,_2> *)&p_function);
  arg.m_data = (uint  [2])
               (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(&p_function);
  pack<double>::set(result_dst,(double *)&arg);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}